

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O1

void __thiscall Channel4op::keyOn(Channel4op *this)

{
  double dVar1;
  Operator *pOVar2;
  double dVar3;
  double dVar4;
  
  pOVar2 = this->op1;
  if (pOVar2->ar < 1) {
    (pOVar2->envelopeGenerator).stage = OFF;
  }
  else {
    dVar3 = log(-(pOVar2->envelopeGenerator).envelope);
    dVar1 = (pOVar2->envelopeGenerator).xMinimumInAttack;
    dVar4 = dVar3 * 1.4426950408889634;
    if (dVar1 <= dVar3 * 1.4426950408889634) {
      dVar4 = dVar1;
    }
    (pOVar2->envelopeGenerator).x = dVar4;
    (pOVar2->envelopeGenerator).stage = ATTACK;
    (pOVar2->phaseGenerator).phase = 0.0;
  }
  pOVar2 = this->op2;
  if (pOVar2->ar < 1) {
    (pOVar2->envelopeGenerator).stage = OFF;
  }
  else {
    dVar3 = log(-(pOVar2->envelopeGenerator).envelope);
    dVar1 = (pOVar2->envelopeGenerator).xMinimumInAttack;
    dVar4 = dVar3 * 1.4426950408889634;
    if (dVar1 <= dVar3 * 1.4426950408889634) {
      dVar4 = dVar1;
    }
    (pOVar2->envelopeGenerator).x = dVar4;
    (pOVar2->envelopeGenerator).stage = ATTACK;
    (pOVar2->phaseGenerator).phase = 0.0;
  }
  pOVar2 = this->op3;
  if (pOVar2->ar < 1) {
    (pOVar2->envelopeGenerator).stage = OFF;
  }
  else {
    dVar3 = log(-(pOVar2->envelopeGenerator).envelope);
    dVar1 = (pOVar2->envelopeGenerator).xMinimumInAttack;
    dVar4 = dVar3 * 1.4426950408889634;
    if (dVar1 <= dVar3 * 1.4426950408889634) {
      dVar4 = dVar1;
    }
    (pOVar2->envelopeGenerator).x = dVar4;
    (pOVar2->envelopeGenerator).stage = ATTACK;
    (pOVar2->phaseGenerator).phase = 0.0;
  }
  pOVar2 = this->op4;
  if (pOVar2->ar < 1) {
    (pOVar2->envelopeGenerator).stage = OFF;
  }
  else {
    dVar3 = log(-(pOVar2->envelopeGenerator).envelope);
    dVar1 = (pOVar2->envelopeGenerator).xMinimumInAttack;
    dVar4 = dVar3 * 1.4426950408889634;
    if (dVar1 <= dVar3 * 1.4426950408889634) {
      dVar4 = dVar1;
    }
    (pOVar2->envelopeGenerator).x = dVar4;
    (pOVar2->envelopeGenerator).stage = ATTACK;
    (pOVar2->phaseGenerator).phase = 0.0;
  }
  (this->super_Channel).feedback[0] = 0.0;
  (this->super_Channel).feedback[1] = 0.0;
  return;
}

Assistant:

void Channel4op::keyOn() {
	op1->keyOn();
	op2->keyOn();
	op3->keyOn();
	op4->keyOn();
	feedback[0] = feedback[1] = 0;
}